

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

int mbedtls_chacha20_update(mbedtls_chacha20_context *ctx,size_t size,uchar *input,uchar *output)

{
  bool bVar1;
  uchar *local_38;
  size_t i;
  size_t offset;
  uchar *output_local;
  uchar *input_local;
  size_t size_local;
  mbedtls_chacha20_context *ctx_local;
  
  i = 0;
  input_local = (uchar *)size;
  while( true ) {
    bVar1 = false;
    if (input_local != (uchar *)0x0) {
      bVar1 = ctx->keystream_bytes_used < 0x40;
    }
    if (!bVar1) break;
    output[i] = input[i] ^ ctx->keystream8[ctx->keystream_bytes_used];
    ctx->keystream_bytes_used = ctx->keystream_bytes_used + 1;
    i = i + 1;
    input_local = input_local + -1;
  }
  for (; (uchar *)0x3f < input_local; input_local = input_local + -0x40) {
    chacha20_block(ctx->state,ctx->keystream8);
    ctx->state[0xc] = ctx->state[0xc] + 1;
    for (local_38 = (uchar *)0x0; local_38 < 0x40; local_38 = (uchar *)((long)local_38 + 8)) {
      output[i + (long)local_38] = input[i + (long)local_38] ^ ctx->keystream8[(long)local_38];
      output[i + (long)local_38 + 1] =
           input[i + (long)local_38 + 1] ^ ctx->keystream8[(long)local_38 + 1];
      output[i + (long)local_38 + 2] =
           input[i + (long)local_38 + 2] ^ ctx->keystream8[(long)local_38 + 2];
      output[i + (long)local_38 + 3] =
           input[i + (long)local_38 + 3] ^ ctx->keystream8[(long)local_38 + 3];
      output[i + (long)local_38 + 4] =
           input[i + (long)local_38 + 4] ^ ctx->keystream8[(long)local_38 + 4];
      output[i + (long)local_38 + 5] =
           input[i + (long)local_38 + 5] ^ ctx->keystream8[(long)local_38 + 5];
      output[i + (long)local_38 + 6] =
           input[i + (long)local_38 + 6] ^ ctx->keystream8[(long)local_38 + 6];
      output[i + (long)local_38 + 7] =
           input[i + (long)local_38 + 7] ^ ctx->keystream8[(long)local_38 + 7];
    }
    i = i + 0x40;
  }
  if (input_local != (uchar *)0x0) {
    chacha20_block(ctx->state,ctx->keystream8);
    ctx->state[0xc] = ctx->state[0xc] + 1;
    for (local_38 = (uchar *)0x0; local_38 < input_local; local_38 = local_38 + 1) {
      output[(long)(local_38 + i)] = input[(long)(local_38 + i)] ^ ctx->keystream8[(long)local_38];
    }
    ctx->keystream_bytes_used = (size_t)input_local;
  }
  return 0;
}

Assistant:

int mbedtls_chacha20_update( mbedtls_chacha20_context *ctx,
                              size_t size,
                              const unsigned char *input,
                              unsigned char *output )
{
    size_t offset = 0U;
    size_t i;

    CHACHA20_VALIDATE_RET( ctx != NULL );
    CHACHA20_VALIDATE_RET( size == 0 || input  != NULL );
    CHACHA20_VALIDATE_RET( size == 0 || output != NULL );

    /* Use leftover keystream bytes, if available */
    while( size > 0U && ctx->keystream_bytes_used < CHACHA20_BLOCK_SIZE_BYTES )
    {
        output[offset] = input[offset]
                       ^ ctx->keystream8[ctx->keystream_bytes_used];

        ctx->keystream_bytes_used++;
        offset++;
        size--;
    }

    /* Process full blocks */
    while( size >= CHACHA20_BLOCK_SIZE_BYTES )
    {
        /* Generate new keystream block and increment counter */
        chacha20_block( ctx->state, ctx->keystream8 );
        ctx->state[CHACHA20_CTR_INDEX]++;

        for( i = 0U; i < 64U; i += 8U )
        {
            output[offset + i  ] = input[offset + i  ] ^ ctx->keystream8[i  ];
            output[offset + i+1] = input[offset + i+1] ^ ctx->keystream8[i+1];
            output[offset + i+2] = input[offset + i+2] ^ ctx->keystream8[i+2];
            output[offset + i+3] = input[offset + i+3] ^ ctx->keystream8[i+3];
            output[offset + i+4] = input[offset + i+4] ^ ctx->keystream8[i+4];
            output[offset + i+5] = input[offset + i+5] ^ ctx->keystream8[i+5];
            output[offset + i+6] = input[offset + i+6] ^ ctx->keystream8[i+6];
            output[offset + i+7] = input[offset + i+7] ^ ctx->keystream8[i+7];
        }

        offset += CHACHA20_BLOCK_SIZE_BYTES;
        size   -= CHACHA20_BLOCK_SIZE_BYTES;
    }

    /* Last (partial) block */
    if( size > 0U )
    {
        /* Generate new keystream block and increment counter */
        chacha20_block( ctx->state, ctx->keystream8 );
        ctx->state[CHACHA20_CTR_INDEX]++;

        for( i = 0U; i < size; i++)
        {
            output[offset + i] = input[offset + i] ^ ctx->keystream8[i];
        }

        ctx->keystream_bytes_used = size;

    }

    return( 0 );
}